

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cExplicitUniformLocationTest.cpp
# Opt level: O2

void glcts::anon_unknown_0::ShaderSourceFactory::streamSubroutineValidators
               (ostringstream *ret,
               vector<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               *subroutineUniforms,GLenum shader,char *outTemporary)

{
  pointer pSVar1;
  bool bVar2;
  ostream *poVar3;
  SubroutineFunction *pSVar4;
  ulong uVar5;
  SubroutineUniform *this;
  int arrayElem;
  int arrayElem_00;
  
  for (uVar5 = 0;
      pSVar1 = (subroutineUniforms->
               super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)(((long)(subroutineUniforms->
                             super__Vector_base<glcts::(anonymous_namespace)::SubroutineUniform,_std::allocator<glcts::(anonymous_namespace)::SubroutineUniform>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pSVar1) / 0x168);
      uVar5 = uVar5 + 1) {
    bVar2 = DefOccurence::occurs(&pSVar1[uVar5].defOccurence,shader);
    if ((bVar2) && (this = pSVar1 + uVar5, this->used == true)) {
      for (arrayElem_00 = 0; arrayElem_00 < this->arraySize; arrayElem_00 = arrayElem_00 + 1) {
        poVar3 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\n    if (any(greaterThan(abs(");
        std::operator<<(poVar3,(string *)&this->name);
        SubroutineUniform::streamArrayStr(this,ret,arrayElem_00);
        std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"(zero) - ");
        pSVar4 = SubroutineUniform::getSelectedFunction(this,arrayElem_00);
        UniformValue::streamValue(&pSVar4->embeddedRetVal,ret,0,0);
        std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"), vec4(0.1)))) {"
                       );
        poVar3 = std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,
                                 "\n       ");
        poVar3 = std::operator<<(poVar3,"validationResult");
        std::operator<<(poVar3," = vec4 (1.0, 0.0, 0.0, 1.0);");
        std::operator<<(&ret->super_basic_ostream<char,_std::char_traits<char>_>,"\n    }");
      }
    }
  }
  return;
}

Assistant:

static void streamSubroutineValidators(std::ostringstream&					 ret,
										   const std::vector<SubroutineUniform>& subroutineUniforms, GLenum shader,
										   const char* outTemporary)
	{
		for (size_t i = 0; i < subroutineUniforms.size(); i++)
		{
			streamSubroutineValidator(ret, subroutineUniforms[i], shader, outTemporary);
		}
	}